

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O3

void test_nested(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *__buf;
  char *__n;
  void *pvVar8;
  void *__s2;
  char *pcVar9;
  char *pcVar10;
  char *extraout_RAX;
  dirent *pdVar11;
  size_t sVar12;
  size_t sVar13;
  DIR *__dirp;
  FILE *__stream;
  long lVar14;
  char *pcVar15;
  uint extraout_EDX;
  char *__dest;
  int paths_index;
  char *pcVar16;
  ulong uVar17;
  DIR *__s;
  DIR *__name;
  char *pcVar18;
  DIR *paths;
  DIR *__filename;
  undefined8 uVar19;
  char *pcVar20;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_6e08 [8];
  undefined1 auStack_6e00 [504];
  ulong uStack_6c08;
  DIR *pDStack_6c00;
  dirent *pdStack_6bf8;
  DIR *pDStack_6bf0;
  DIR *pDStack_6be8;
  stat sStack_6be0;
  char acStack_6b50 [512];
  size_t sStack_6950;
  dirent *pdStack_6948;
  DIR *pDStack_6940;
  char *pcStack_6938;
  code *pcStack_6930;
  char *pcStack_6928;
  ulong uStack_6920;
  char *pcStack_6918;
  DIR *pDStack_6910;
  code *pcStack_6908;
  undefined8 uStack_68d0;
  undefined1 *puStack_68c8;
  undefined1 *puStack_68c0;
  undefined1 auStack_68b0 [8];
  char *pcStack_68a8;
  char *pcStack_6898;
  char *pcStack_6890;
  undefined8 uStack_6888;
  undefined8 uStack_6870;
  DIR aDStack_6800 [25944];
  char *pcStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  code *apcStack_288 [2];
  undefined1 auStack_278 [116];
  uint uStack_204;
  char acStack_200 [312];
  undefined8 uStack_c8;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *pcStack_98;
  undefined8 uStack_90;
  code *pcStack_88;
  char *pcStack_80;
  undefined8 uStack_78;
  char *pcStack_70;
  int *piStack_68;
  char *pcStack_60;
  char *pcStack_58;
  code *pcStack_50;
  int i32;
  char *utf8;
  
  pcStack_50 = (code *)0x13d923;
  uStack_78 = bson_bcon_magic();
  pcStack_58 = (char *)0x0;
  pcStack_60 = "}";
  piStack_68 = (int *)0xa;
  pcStack_70 = (char *)0xf;
  pcStack_80 = (char *)0x13d978;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_50 = (code *)0x13d984;
  uStack_78 = bson_bcone_magic();
  piStack_68 = &i32;
  pcStack_58 = (char *)0x0;
  pcStack_60 = "}";
  pcStack_70 = (char *)0xf;
  pcStack_80 = "bar";
  pcStack_88 = (code *)0x141970;
  uStack_90 = 0x13d9c0;
  cVar1 = bcon_extract(uVar6,"hello",uStack_78,0,&utf8,"foo");
  if (cVar1 == '\0') {
    pcStack_50 = (code *)0x13da00;
    test_nested_cold_1();
LAB_0013da00:
    pcStack_50 = (code *)0x13da05;
    test_nested_cold_2();
  }
  else {
    pcStack_50 = (code *)0x13d9d9;
    iVar2 = strcmp("world",utf8);
    if (iVar2 != 0) goto LAB_0013da00;
    if (i32 == 10) {
      pcStack_50 = (code *)0x13d9ec;
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_50 = test_skip;
  test_nested_cold_3();
  pcStack_50 = (code *)0x14ad57;
  pcStack_58 = "bar";
  pcStack_60 = (char *)0x0;
  piStack_68 = (int *)0x14e902;
  pcStack_70 = "foo";
  pcStack_88 = (code *)0x13da1a;
  uStack_78 = uVar6;
  pcStack_b0 = (char *)bson_bcon_magic();
  uStack_90 = 0;
  pcStack_98 = "}";
  pcStack_a0 = (char *)0xa;
  pcStack_a8 = (char *)0xf;
  pcStack_b8 = (char *)0x13da6d;
  uVar6 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_88 = (code *)0x13da79;
  pcVar7 = (char *)bson_bcone_magic();
  pcVar20 = "}";
  uStack_90 = 0;
  pcStack_98 = "}";
  pcStack_a0 = (char *)0x10;
  pcStack_a8 = (char *)0x1c;
  pcStack_b8 = "bar";
  pcStack_c0 = "{";
  uStack_c8 = 0x13dab5;
  pcStack_b0 = pcVar7;
  cVar1 = bcon_extract(uVar6,"hello",pcVar7,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_88 = (code *)0x13db17;
    test_skip_cold_1();
  }
  else {
    uStack_90 = 0;
    pcStack_98 = "}";
    pcStack_a0 = (char *)0x12;
    pcStack_a8 = (char *)0x1c;
    pcStack_b8 = "bar";
    pcStack_c0 = "{";
    uStack_c8 = 0x13daf4;
    pcStack_b0 = pcVar7;
    cVar1 = bcon_extract(uVar6,"hello",pcVar7,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar6);
      return;
    }
  }
  pcStack_88 = test_iter;
  test_skip_cold_2();
  pcStack_88 = (code *)0x14e902;
  pcStack_98 = "bar";
  pcStack_a0 = "}";
  pcStack_b0 = "{";
  apcStack_288[0] = (code *)0x13db39;
  pcStack_a8 = pcVar7;
  uStack_90 = uVar6;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_288[0] = (code *)0x13db60;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_288[0] = (code *)0x13db68;
  uVar6 = bson_bcone_magic();
  pcVar9 = acStack_200;
  pcVar16 = "foo";
  pcVar15 = (char *)0x1d;
  uVar19 = 0;
  apcStack_288[0] = (code *)0x13db88;
  pcVar18 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar6);
  if (cVar1 == '\0') {
    apcStack_288[0] = (code *)0x13dd34;
    uVar6 = extraout_XMM1_Qa;
    test_iter_cold_1();
LAB_0013dd34:
    apcStack_288[0] = (code *)0x13dd39;
    test_iter_cold_2();
  }
  else {
    pcVar18 = acStack_200;
    apcStack_288[0] = (code *)0x13db9d;
    iVar2 = bson_iter_type();
    uVar6 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013dd34;
    pcVar18 = acStack_200;
    apcStack_288[0] = (code *)0x13dbb3;
    iVar2 = bson_iter_int32();
    uVar6 = extraout_XMM1_Qa_01;
    if (iVar2 == 10) {
      uVar19 = 0;
      apcStack_288[0] = (code *)0x13dbdf;
      __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_200);
      apcStack_288[0] = (code *)0x13dbea;
      pcVar7 = (char *)bson_get_data(__n_00);
      apcStack_288[0] = (code *)0x13dbf5;
      __buf = (char *)bson_get_data(__n);
      if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
        apcStack_288[0] = (code *)0x13dc09;
        pvVar8 = (void *)bson_get_data(__n);
        apcStack_288[0] = (code *)0x13dc14;
        __s2 = (void *)bson_get_data(__n_00);
        apcStack_288[0] = (code *)0x13dc22;
        iVar2 = bcmp(pvVar8,__s2,(ulong)*(uint *)(__n + 4));
        if (iVar2 == 0) {
          apcStack_288[0] = (code *)0x13dc2e;
          bson_destroy(__n);
          apcStack_288[0] = (code *)0x13dc36;
          bson_destroy(__n_00);
          return;
        }
      }
      apcStack_288[0] = (code *)0x13dc4f;
      pcVar20 = (char *)bson_as_canonical_extended_json(__n_00);
      apcStack_288[0] = (code *)0x13dc5c;
      pcVar9 = (char *)bson_as_canonical_extended_json(__n);
      uVar3 = *(uint *)(__n_00 + 4);
      uVar4 = *(uint *)(__n + 4);
      uVar6 = extraout_XMM1_Qa_02;
      if (uVar3 != 0) {
        uVar17 = 0;
        do {
          if (uVar4 == (uint)uVar17) break;
          if (pcVar7[uVar17] != __buf[uVar17]) goto LAB_0013dd28;
          uVar17 = uVar17 + 1;
        } while (uVar3 != (uint)uVar17);
      }
      if (uVar3 < uVar4) {
        uVar3 = uVar4;
      }
      uVar17 = (ulong)(uVar3 - 1);
      pcVar15 = pcVar20;
      while( true ) {
        apcStack_288[0] = (code *)0x13dca8;
        fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar17);
        apcStack_288[0] = (code *)0x13dcc0;
        uVar3 = open("failure.bad.bson",0x42,0x1a0);
        pcVar20 = (char *)(ulong)uVar3;
        pcVar18 = "failure.expected.bson";
        pcVar16 = (char *)0x42;
        apcStack_288[0] = (code *)0x13dcdb;
        uVar4 = open("failure.expected.bson",0x42,0x1a0);
        uStack_204 = uVar3;
        if (uVar3 == 0xffffffff) break;
        if (uVar4 == 0xffffffff) goto LAB_0013dd43;
        pcVar20 = (char *)(ulong)uVar4;
        __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
        pcVar18 = (char *)(ulong)uVar3;
        apcStack_288[0] = (code *)0x13dd01;
        pcVar16 = pcVar7;
        pcVar10 = (char *)write(uVar3,pcVar7,(size_t)__n_00);
        if (pcVar10 != __n_00) goto LAB_0013dd48;
        __n = (char *)(ulong)*(uint *)(__n + 4);
        apcStack_288[0] = (code *)0x13dd17;
        pcVar16 = __buf;
        pcVar18 = pcVar20;
        pcVar10 = (char *)write(uVar4,__buf,(size_t)__n);
        if (pcVar10 != __n) goto LAB_0013dd4d;
        uVar17 = (ulong)uVar4;
        apcStack_288[0] = (code *)0x13dd28;
        test_iter_cold_6();
        pcVar9 = extraout_RAX;
LAB_0013dd28:
        uVar17 = uVar17 & 0xffffffff;
        pcVar15 = pcVar20;
      }
      goto LAB_0013dd3e;
    }
  }
  apcStack_288[0] = (code *)0x13dd3e;
  test_iter_cold_3();
LAB_0013dd3e:
  apcStack_288[0] = (code *)0x13dd43;
  test_iter_cold_8();
LAB_0013dd43:
  apcStack_288[0] = (code *)0x13dd48;
  test_iter_cold_7();
LAB_0013dd48:
  apcStack_288[0] = (code *)0x13dd4d;
  test_iter_cold_4();
LAB_0013dd4d:
  apcStack_288[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_68c0 = auStack_68b0;
  if (extraout_AL != '\0') {
    uStack_6870 = uVar6;
  }
  pcStack_6908 = (code *)0x13ddd5;
  pcStack_68a8 = pcVar16;
  pcStack_6898 = pcVar15;
  pcStack_6890 = pcVar9;
  uStack_6888 = uVar19;
  pcStack_2a8 = __n;
  pcStack_2a0 = pcVar7;
  pcStack_298 = __buf;
  pcStack_290 = __n_00;
  apcStack_288[0] = (code *)&pcStack_88;
  bcon_extract_ctx_init(aDStack_6800);
  puStack_68c8 = auStack_278;
  uStack_68d0 = 0x3000000010;
  uVar6 = 0x10;
  if (0 < (int)(uint)pcStack_68a8) {
    uVar3 = (uint)pcStack_68a8;
    do {
      pcStack_6908 = (code *)0x13de41;
      __s = aDStack_6800;
      pcVar7 = pcVar18;
      cVar1 = bcon_extract_ctx_va(pcVar18,aDStack_6800,&uStack_68d0);
      iVar2 = (int)uVar6;
      if (cVar1 == '\0') {
        pcStack_6908 = assemble_path;
        test_extract_ctx_helper_cold_1();
        pcStack_6930 = (code *)0x13de73;
        __name = __s;
        pcStack_6928 = pcVar18;
        uStack_6920 = (ulong)uVar3;
        pcStack_6918 = pcVar20;
        pDStack_6910 = aDStack_6800;
        pcStack_6908 = (code *)&uStack_68d0;
        pdVar11 = (dirent *)strlen(pcVar7);
        pcStack_6930 = (code *)0x13de7e;
        paths = __s;
        sVar12 = strlen((char *)__s);
        if ((int)sVar12 + (int)pdVar11 < 499) {
          pcStack_6930 = (code *)0x13de9a;
          memset(__dest,0,500);
          pcStack_6930 = (code *)0x13dea8;
          strncat(__dest,pcVar7,(long)(int)pdVar11);
          pcStack_6930 = (code *)0x13deb0;
          sVar13 = strlen(__dest);
          (__dest + sVar13)[0] = '/';
          (__dest + sVar13)[1] = '\0';
          pcStack_6930 = (code *)0x13dec4;
          strncat(__dest,(char *)__s,(long)(int)sVar12);
          pcVar7 = __dest;
          do {
            if (*pcVar7 == '\\') {
              *pcVar7 = '/';
            }
            else if (*pcVar7 == '\0') {
              return;
            }
            pcVar7 = pcVar7 + 1;
          } while( true );
        }
        pcStack_6930 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar17 = (ulong)extraout_EDX;
        pDStack_6be8 = (DIR *)0x13df0c;
        __filename = __name;
        sStack_6950 = sVar12;
        pdStack_6948 = pdVar11;
        pDStack_6940 = __s;
        pcStack_6938 = pcVar7;
        pcStack_6930 = (code *)apcStack_288;
        __dirp = opendir((char *)__name);
        pDStack_6bf0 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013e018;
        pDStack_6be8 = (DIR *)0x13df20;
        __filename = __dirp;
        pdVar11 = readdir(__dirp);
        do {
          if (pdVar11 == (dirent *)0x0) {
LAB_0013dff7:
            pDStack_6be8 = (DIR *)0x13dfff;
            closedir(__dirp);
            return;
          }
          paths_index = (int)uVar17;
          if (iVar2 <= paths_index) {
            pDStack_6be8 = (DIR *)0x13e018;
            collect_tests_from_dir_cold_1();
            pDStack_6bf0 = __dirp;
LAB_0013e018:
            pDStack_6be8 = (DIR *)get_bson_from_json_file;
            collect_tests_from_dir_cold_2();
            uStack_6c08 = uVar17;
            pDStack_6c00 = paths;
            pdStack_6bf8 = pdVar11;
            pDStack_6be8 = __name;
            __stream = fopen((char *)__filename,"rb");
            if (__stream != (FILE *)0x0) {
              fseek(__stream,0,2);
              sVar12 = ftell(__stream);
              fseek(__stream,0,0);
              if (0 < (long)sVar12) {
                pvVar8 = (void *)bson_malloc0(sVar12);
                sVar13 = fread(pvVar8,1,sVar12,__stream);
                if (sVar13 != sVar12) {
                  abort();
                }
                fclose(__stream);
                if (pvVar8 != (void *)0x0) {
                  lVar14 = bson_new_from_json(pvVar8,sVar12,auStack_6e08);
                  if (lVar14 == 0) {
                    fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_6e00);
                    abort();
                  }
                  bson_free(pvVar8);
                }
              }
            }
            return;
          }
          while ((pdVar11->d_name[0] == '.' &&
                 (((pdVar11->d_name[1] == '.' && (pdVar11->d_name[2] == '\0')) ||
                  (pdVar11->d_name[1] == '\0'))))) {
            pDStack_6be8 = (DIR *)0x13df58;
            pdVar11 = readdir(__dirp);
            if (pdVar11 == (dirent *)0x0) goto LAB_0013dff7;
          }
          pcVar7 = pdVar11->d_name;
          pDStack_6be8 = (DIR *)0x13df7c;
          assemble_path((char *)__name,pcVar7,acStack_6b50);
          pDStack_6be8 = (DIR *)0x13df87;
          iVar5 = stat(pcVar7,&sStack_6be0);
          if ((iVar5 == 0) && ((sStack_6be0.st_mode & 0xf000) == 0x4000)) {
            pDStack_6be8 = (DIR *)0x13dfb1;
            uVar3 = collect_tests_from_dir((char (*) [500])paths,acStack_6b50,paths_index,iVar2);
            uVar17 = (ulong)uVar3;
          }
          else {
            pDStack_6be8 = (DIR *)0x13dfc4;
            pcVar20 = strstr(pcVar7,".json");
            if (pcVar20 != (char *)0x0) {
              uVar17 = (ulong)(paths_index + 1);
              pDStack_6be8 = (DIR *)0x13dfe3;
              assemble_path((char *)__name,pcVar7,(char *)(paths + (long)paths_index * 500));
            }
          }
          pDStack_6be8 = (DIR *)0x13dfeb;
          __filename = __dirp;
          pdVar11 = readdir(__dirp);
        } while( true );
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

static void
test_nested (void)
{
   const char *utf8;
   int i32;

   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_UTF8 (utf8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_INT32 (i32),
                         "}"));

   BSON_ASSERT (strcmp ("world", utf8) == 0);
   BSON_ASSERT (i32 == 10);

   bson_destroy (bcon);
}